

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_humanize(char *p,int len,uint64_t v,lws_humanize_unit_t *schema)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char **ppcVar11;
  long lVar12;
  ulong uVar13;
  lws_humanize_unit_t *plVar14;
  char *format;
  int iVar15;
  byte bVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  
  plVar14 = schema + 1;
  while ((uVar19 = plVar14[-1].factor, v < uVar19 && (uVar19 != 1))) {
    ppcVar11 = &plVar14->name;
    plVar14 = plVar14 + 1;
    if (*ppcVar11 == (char *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/libwebsockets.c"
                    ,0x4a0,"int lws_humanize(char *, int, uint64_t, const lws_humanize_unit_t *)");
    }
  }
  *p = ' ';
  if (uVar19 == 1) {
    pcVar18 = p + 5;
    uVar19 = 1;
    iVar15 = -4;
    do {
      bVar16 = 0x20;
      if (uVar19 <= v) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar19;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = v;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = SUB168(auVar4 / auVar1,0);
        bVar16 = SUB161(auVar4 / auVar1,0) +
                 ((byte)(SUB164(auVar8 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 | 0x30;
      }
      pcVar18[-1] = bVar16;
      pcVar18 = pcVar18 + -1;
      uVar19 = uVar19 * 10;
      iVar15 = iVar15 + 1;
    } while (iVar15 != 0);
    lVar12 = -0x500000000;
    format = "%s    ";
    lVar17 = 5;
    if (v < 10000) goto LAB_0010fc7f;
  }
  else {
    uVar13 = v / plVar14[-1].factor;
    uVar19 = 1;
    lVar12 = 5;
    do {
      bVar16 = 0x20;
      if (uVar19 <= uVar13) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar19;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar13;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = SUB168(auVar5 / auVar2,0);
        bVar16 = SUB161(auVar5 / auVar2,0) +
                 ((byte)(SUB164(auVar9 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 | 0x30;
      }
      p[lVar12 + -1] = bVar16;
      uVar19 = uVar19 * 10;
      lVar12 = lVar12 + -1;
    } while ((int)lVar12 != 1);
    if (9999 < uVar13) {
      p[lVar12] = '!';
    }
    p[5] = '.';
    auVar6._8_8_ = 0;
    auVar6._0_8_ = v % plVar14[-1].factor;
    uVar13 = SUB168(auVar6 / (ZEXT816(0) * ZEXT816(0x20c49ba5e353f7cf) >> 0x44 &
                             (undefined1  [16])0xfffffffffffffff),0);
    pcVar18 = p + 9;
    uVar19 = 1;
    iVar15 = -3;
    do {
      bVar16 = 0x30;
      if (uVar19 <= uVar13) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar19;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar13;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = SUB168(auVar7 / auVar3,0);
        bVar16 = SUB161(auVar7 / auVar3,0) +
                 ((byte)(SUB164(auVar10 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 | 0x30;
      }
      pcVar18[-1] = bVar16;
      pcVar18 = pcVar18 + -1;
      uVar19 = uVar19 * 10;
      iVar15 = iVar15 + 1;
    } while (iVar15 != 0);
    lVar12 = -0x900000000;
    format = "%s";
    lVar17 = 9;
    if (uVar13 < 1000) goto LAB_0010fc7f;
  }
  *pcVar18 = '!';
LAB_0010fc7f:
  iVar15 = lws_snprintf(p + lVar17,(long)(((ulong)(uint)len << 0x20) + lVar12) >> 0x20,format,
                        plVar14[-1].name);
  return iVar15;
}

Assistant:

int
lws_humanize(char *p, int len, uint64_t v, const lws_humanize_unit_t *schema)
{
	char *end = p + len;

	do {
		if (v >= schema->factor || schema->factor == 1) {
			if (schema->factor == 1) {
				*p++ = ' ';
				p += decim(p, v, 4, 0);
				return lws_snprintf(p, lws_ptr_diff(end, p),
						    "%s    ", schema->name);
			}

			*p++ = ' ';
			p += decim(p, v / schema->factor, 4, 0);
			*p++ = '.';
			p += decim(p, (v % schema->factor) /
					(schema->factor / 1000), 3, 1);

			return lws_snprintf(p, lws_ptr_diff(end, p),
					    "%s", schema->name);
		}
		schema++;
	} while (schema->name);

	assert(0);
	strncpy(p, "unknown value", len);

	return 0;
}